

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printAssign(JSPrinter *this,Ref node)

{
  Assign *pAVar1;
  
  pAVar1 = cashew::Value::asAssign(node.inst);
  printChild(this,(pAVar1->super_Value).field_1.ref.inst,node,-1);
  space(this);
  emit(this,'=');
  space(this);
  printChild(this,(pAVar1->value_).inst,node,1);
  return;
}

Assistant:

void printAssign(Ref node) {
    auto* assign = node->asAssign();
    printChild(assign->target(), node, -1);
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }